

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::getSupport(RuleWavelet *this,int point)

{
  int iVar1;
  __type _Var2;
  int point_local;
  RuleWavelet *this_local;
  
  if (this->order == 1) {
    if (point < 3) {
      this_local = (RuleWavelet *)0x3ff0000000000000;
    }
    else {
      iVar1 = Maths::intlog2(point + -1);
      _Var2 = ::std::pow<double,int>(2.0,iVar1 + -2);
      this_local = (RuleWavelet *)(3.0 / (_Var2 * 4.0));
    }
  }
  else if (point < 9) {
    this_local = (RuleWavelet *)0x4000000000000000;
  }
  else {
    iVar1 = Maths::intlog2(point + -1);
    _Var2 = ::std::pow<double,int>(2.0,iVar1 + -3);
    this_local = (RuleWavelet *)(4.2 / (_Var2 * 3.0));
  }
  return (double)this_local;
}

Assistant:

double RuleWavelet::getSupport(int point) const{
    if (order == 1){
        if (point <= 2) return 1.0; // linear-polynomial points
        return 3.0  / ( 4.0 * std::pow(2.0, Maths::intlog2(point - 1) - 2) );
    }else{
        if (point <= 8) return 2.0; // cubic-polynomial points and level 1 have global support
        // the strange 4.2 compensates for numerical errors in computing the cubic-cascade
        return 4.2 / (3.0 * std::pow(2.0, Maths::intlog2(point - 1) - 3));
    }
}